

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QNetworkCacheMetaDataPrivate>::detach_helper
          (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *this)

{
  QNetworkCacheMetaDataPrivate *pQVar1;
  Data *pDVar2;
  QNetworkCacheMetaDataPrivate *pQVar3;
  
  pQVar3 = (QNetworkCacheMetaDataPrivate *)operator_new(0x38);
  pQVar1 = (this->d).ptr;
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  QUrl::QUrl(&pQVar3->url,&pQVar1->url);
  QDateTime::QDateTime(&pQVar3->lastModified,&pQVar1->lastModified);
  QDateTime::QDateTime(&pQVar3->expirationDate,&pQVar1->expirationDate);
  QHttpHeaders::QHttpHeaders(&pQVar3->headers,&pQVar1->headers);
  pDVar2 = (pQVar1->attributes).d;
  (pQVar3->attributes).d = pDVar2;
  if ((pDVar2 != (Data *)0x0) && ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)
     ) {
    LOCK();
    (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar3->saveToDisk = pQVar1->saveToDisk;
  LOCK();
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QNetworkCacheMetaDataPrivate *)0x0) {
      QHash<QNetworkRequest::Attribute,_QVariant>::~QHash(&pQVar1->attributes);
      QHttpHeaders::~QHttpHeaders(&pQVar1->headers);
      QDateTime::~QDateTime(&pQVar1->expirationDate);
      QDateTime::~QDateTime(&pQVar1->lastModified);
      QUrl::~QUrl(&pQVar1->url);
    }
    operator_delete(pQVar1,0x38);
  }
  (this->d).ptr = pQVar3;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}